

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkSort.c
# Opt level: O3

void dup_needed_pipes(int pipeAmount,int (*pipes) [2],int neededReadPipe,int neededWritePipe)

{
  int iVar1;
  undefined4 in_register_0000003c;
  long lVar2;
  ulong uVar3;
  
  lVar2 = CONCAT44(in_register_0000003c,pipeAmount);
  uVar3 = 0;
  do {
    if (((ulong)pipes & 0xffffffff) == uVar3) {
      iVar1 = dup2(*(int *)(lVar2 + 4 + ((ulong)pipes & 0xffffffff) * 8),1);
      if (iVar1 == -1) {
        dup_needed_pipes_cold_2();
LAB_001018cc:
        dup_needed_pipes_cold_1();
        halt_baddata();
      }
    }
    else if ((uint)neededReadPipe == uVar3) {
      iVar1 = dup2(*(int *)(lVar2 + (ulong)(uint)neededReadPipe * 8),0);
      if (iVar1 == -1) goto LAB_001018cc;
    }
    close(*(int *)(lVar2 + 4 + uVar3 * 8));
    close(*(int *)(lVar2 + uVar3 * 8));
    uVar3 = uVar3 + 1;
    if (uVar3 == 4) {
      return;
    }
  } while( true );
}

Assistant:

static void dup_needed_pipes(int pipeAmount, int pipes[pipeAmount][2], int neededReadPipe, int neededWritePipe)
{
	for (int i = 0; i < pipeAmount; i++)
	{

		if (i == neededReadPipe)
		{
			if (dup2(pipes[i][1], STDOUT_FILENO) == -1)
			{
				ERROR_EXIT("dup-Error");
			}
		}
		else if (i == neededWritePipe)
		{
			if (dup2(pipes[i][0], STDIN_FILENO) == -1)
			{
				ERROR_EXIT("dup-Error");
			}
		}

		close(pipes[i][1]);
		close(pipes[i][0]);
	}
}